

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

collision_shape_ptr __thiscall APhyBullet::BulletEngine::createCompoundShape(BulletEngine *this)

{
  btCompoundShape *args;
  Counter *this_00;
  int in_stack_00000018;
  bool in_stack_0000001f;
  btCompoundShape *in_stack_00000020;
  undefined8 in_stack_ffffffffffffffd0;
  APhyBulletCollisionShapeType args_1;
  ref<aphy::collision_shape> local_10 [2];
  
  args_1 = (APhyBulletCollisionShapeType)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  args = (btCompoundShape *)btCompoundShape::operator_new(0x128223);
  btCompoundShape::btCompoundShape(in_stack_00000020,in_stack_0000001f,in_stack_00000018);
  aphy::
  makeObject<APhyBullet::BulletCollisionShape,btCompoundShape*,APhyBullet::APhyBulletCollisionShapeType>
            (args,args_1);
  this_00 = aphy::ref<aphy::collision_shape>::disown(local_10);
  aphy::ref<aphy::collision_shape>::~ref((ref<aphy::collision_shape> *)this_00);
  return this_00;
}

Assistant:

collision_shape_ptr BulletEngine::createCompoundShape()
{
    return makeObject<BulletCollisionShape> (
        new btCompoundShape(),
        APhyBulletCollisionShapeType::Compound
    ).disown();
}